

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O2

void __thiscall
Eigen::internal::
binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Transpose<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
::binary_evaluator(binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Transpose<const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                   *this,XprType *xpr)

{
  mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
  ::mapbase_evaluator((mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                       *)&(this->m_lhsImpl).
                          super_evaluator<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                          .
                          super_unary_evaluator<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_Eigen::internal::IndexBased,_double>
                          .
                          super_evaluator_wrapper_base<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                          .m_argImpl,(XprType *)xpr);
  (this->m_rhsImpl).super_evaluator<Eigen::Transpose<const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  .
  super_unary_evaluator<Eigen::Transpose<const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_double>
  .m_argImpl.super_evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>.m_data =
       (((xpr->m_rhs).m_matrix)->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).
       m_storage.m_data;
  return;
}

Assistant:

binary_evaluator(const XprType& xpr)
    : m_functor(xpr.functor()),
      m_lhsImpl(xpr.lhs()), 
      m_rhsImpl(xpr.rhs())  
  {
    EIGEN_INTERNAL_CHECK_COST_VALUE(functor_traits<BinaryOp>::Cost);
    EIGEN_INTERNAL_CHECK_COST_VALUE(CoeffReadCost);
  }